

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_alloc.c
# Opt level: O2

string_alloc_t * string_pool_create(size_t max_length)

{
  string_alloc_t *psVar1;
  size_t sVar2;
  
  psVar1 = (string_alloc_t *)malloc(0x18);
  if (psVar1 != (string_alloc_t *)0x0) {
    sVar2 = 0x400;
    if (0x400 < max_length) {
      sVar2 = max_length;
    }
    psVar1->nstrings = 0;
    psVar1->strings = (string_t *)0x0;
    psVar1->max_length = sVar2;
  }
  return psVar1;
}

Assistant:

string_alloc_t *string_pool_create(size_t max_length) {
    string_alloc_t *a_str;
    
    if (NULL == (a_str = (string_alloc_t *)malloc(sizeof(*a_str)))) {
    	return NULL;
    }
    
    if (max_length < MIN_STR_SIZE) max_length = MIN_STR_SIZE;
    
    a_str->nstrings    = 0;
    a_str->max_length  = max_length;
    a_str->strings     = NULL;
    
    return a_str;
}